

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O3

bool __thiscall DeleteMessage::fillMe(DeleteMessage *this,string *message)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_30;
  
  if (this->parameter_count == 1) {
    if ((message->_M_string_length != 0) &&
       (pcVar5 = (message->_M_dataplus)._M_p, 0xfffffff5 < (int)*pcVar5 - 0x3aU && *pcVar5 != 0x30))
    {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      *piVar2 = 0;
      lVar3 = strtol(pcVar5,&local_30,10);
      if (local_30 == pcVar5) {
        std::__throw_invalid_argument("stoi");
      }
      else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
        if (*piVar2 == 0) {
          *piVar2 = iVar1;
        }
        this->chosen_message = (int)lVar3;
        pcVar5 = (this->super_ServerOperation).EXECUTEPENDING;
        pcVar6 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
        strlen(pcVar5);
        goto LAB_00104151;
      }
      uVar4 = std::__throw_out_of_range("stoi");
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      _Unwind_Resume(uVar4);
    }
    pcVar6 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    pcVar5 = "Invalid Message-Number - Must be a number bigger than 0!";
  }
  else if (this->parameter_count == 0) {
    if (0xfffffffffffffff6 < message->_M_string_length - 10) {
      this->parameter_count = 1;
      std::__cxx11::string::_M_assign((string *)&this->username);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_ServerOperation).statusMessage,0,
                 (char *)(this->super_ServerOperation).statusMessage._M_string_length,0x1071cd);
      return true;
    }
    pcVar6 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    pcVar5 = "invalid username - Max 8 Characters!";
  }
  else {
    pcVar6 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    pcVar5 = "Fatal Error! Parameter is not set! Connection closed";
  }
LAB_00104151:
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar6,(ulong)pcVar5);
  return false;
}

Assistant:

bool DeleteMessage::fillMe(string message) {
    //fill the needed parameter

    switch(parameter_count){
        case 0:
            ///first parameter, check if valid input for a userdirectory
            if(message.length() <= 9 && message.length() > 0){
                parameter_count ++;
                username = message;
                username.pop_back();
                ///give user the information to next input, if everything went well
                statusMessage = "Message-number:";
                return true;
            }else {
                ///if invalid input, send the information to the client and return false
                statusMessage = "invalid username - Max 8 Characters!";
                return false;
            }
        case 1:
            ///check if second input is valid, if yes save the messagenumber.
            if(!message.empty() && isdigit(message[0]) && message[0] != '0'){
                chosen_message = stoi(message);
                ///change status to "ready for execute"
                statusMessage = EXECUTEPENDING;
                return false;
            }else{
                statusMessage = "Invalid Message-Number - Must be a number bigger than 0!";
                return false;
            }
        default:
            ///shouldn't be called anyway - if there is. return false and break this function.
            statusMessage = "Fatal Error! Parameter is not set! Connection closed";
            return false;
    }
}